

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitArray.h
# Opt level: O0

BitArrayView * __thiscall ZXing::BitArrayView::skipBits(BitArrayView *this,int n)

{
  bool bVar1;
  out_of_range *this_00;
  int in_ESI;
  BitArrayView *in_RDI;
  BitArray *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc0;
  
  __gnu_cxx::
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_RDI,(difference_type)in_stack_ffffffffffffffc0);
  BitArray::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator>
                    (in_stack_ffffffffffffffc0,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&in_RDI->cur,(long)in_ESI);
    return in_RDI;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"BitArrayView::skipBits() out of range.");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

BitArrayView& skipBits(int n)
	{
		if (cur + n > bits.end())
			throw std::out_of_range("BitArrayView::skipBits() out of range.");
		cur += n;
		return *this;
	}